

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<Arguments> * __thiscall
cmArgumentParser<Arguments>::BindParsedKeywords
          (cmArgumentParser<Arguments> *this,
          offset_in_Arguments_to_vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          member)

{
  anon_class_8_1_60e67bd8 local_40;
  KeywordNameAction local_38;
  offset_in_Arguments_to_vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_18;
  offset_in_Arguments_to_vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  member_local;
  cmArgumentParser<Arguments> *this_local;
  
  local_40.member = member;
  local_18 = member;
  member_local = (offset_in_Arguments_to_vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )this;
  std::function<void(ArgumentParser::Instance&,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<cmArgumentParser<(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>::BindParsedKeywords(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>(anonymous_namespace)::HandleGenerateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments::*)::_lambda(ArgumentParser::Instance&,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void(ArgumentParser::Instance&,std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_38,&local_40);
  ArgumentParser::Base::BindParsedKeyword(&this->super_Base,&local_38);
  std::
  function<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_38);
  return this;
}

Assistant:

cmArgumentParser& BindParsedKeywords(
    std::vector<cm::string_view> Result::*member)
  {
    this->Base::BindParsedKeyword(
      [member](Instance& instance, cm::string_view arg) {
        (static_cast<Result*>(instance.Result)->*member).emplace_back(arg);
      });
    return *this;
  }